

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<QGraphicsItemPrivate::ExtraStruct>::data(QList<QGraphicsItemPrivate::ExtraStruct> *this)

{
  QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *this_00;
  ExtraStruct *pEVar1;
  QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *in_RDI;
  
  detach((QList<QGraphicsItemPrivate::ExtraStruct> *)0x99cf3c);
  this_00 = (QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)
            QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::operator->(in_RDI);
  pEVar1 = QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::data(this_00);
  return pEVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }